

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O0

int m2v_row_iszero(m2v *M,int r)

{
  int iVar1;
  int bit_in_base;
  m2v_base mVar2;
  long lVar3;
  int in_ESI;
  m2v *in_RDI;
  m2v_base m;
  int oe;
  int o;
  int local_18;
  
  local_18 = m2v__get_word(in_RDI,in_ESI,0);
  iVar1 = m2v__get_word(in_RDI,in_ESI,in_RDI->n_col + -1);
  do {
    if (iVar1 <= local_18) {
      bit_in_base = m2v__get_bit(in_RDI,in_RDI->n_col + -1);
      mVar2 = m2v__get_mask(bit_in_base);
      if ((in_RDI->e[iVar1] & mVar2 * 2 - 1) != 0) {
        return 0;
      }
      return 1;
    }
    lVar3 = (long)local_18;
    local_18 = local_18 + 1;
  } while (in_RDI->e[lVar3] == 0);
  return 0;
}

Assistant:

int m2v_row_iszero(const m2v* M, int r)
{
	assert(0 <= r && r < M->n_row);

	int o = get_word(M, r, 0);
	const int oe = get_word(M, r, M->n_col - 1);

	/* Check all sections but the last */
	while (o < oe) {
		if (M->e[o++] != 0)
			return 0;
	}

	/* Check last section, using correct masking */
	const m2v_base m = (get_mask(get_bit(M, M->n_col - 1)) << 1) - 1;
	if ((M->e[oe] & m) != 0)
		return 0;
	return 1;
}